

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateLibraryIncludes
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  int i;
  int i_00;
  char *pcVar2;
  FileDescriptor *descriptor;
  string sStack_58;
  string local_38;
  
  io::Printer::Print(printer,"#include <google/protobuf/stubs/common.h>\n\n");
  SimpleItoa_abi_cxx11_(&local_38,(protobuf *)0x2dd278,i);
  SimpleItoa_abi_cxx11_(&sStack_58,(protobuf *)0x2dd278,i_00);
  io::Printer::Print(printer,
                     "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n#error This file was generated by a newer version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please update\n#error your headers.\n#endif\n#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n#error This file was generated by an older version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please\n#error regenerate this file with a newer version of protoc.\n#endif\n\n"
                     ,"min_header_version",&local_38,"protoc_version",&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Print(printer,
                     "#include <google/protobuf/io/coded_stream.h>\n#include <google/protobuf/arena.h>\n#include <google/protobuf/arenastring.h>\n#include <google/protobuf/generated_message_table_driven.h>\n#include <google/protobuf/generated_message_util.h>\n"
                    );
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    pcVar2 = "#include <google/protobuf/metadata.h>\n";
  }
  else {
    pcVar2 = "#include <google/protobuf/metadata_lite.h>\n";
  }
  io::Printer::Print(printer,pcVar2);
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
      pcVar2 = "#include <google/protobuf/message.h>\n";
    }
    else {
      pcVar2 = "#include <google/protobuf/message_lite.h>\n";
    }
    io::Printer::Print(printer,pcVar2);
  }
  io::Printer::Print(printer,
                     "#include <google/protobuf/repeated_field.h>  // IWYU pragma: export\n#include <google/protobuf/extension_set.h>  // IWYU pragma: export\n"
                    );
  bVar1 = HasMapFields(this->file_);
  if (bVar1) {
    io::Printer::Print(printer,"#include <google/protobuf/map.h>  // IWYU pragma: export\n");
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
      pcVar2 = "#include <google/protobuf/map_field_inl.h>\n";
    }
    else {
      pcVar2 = "#include <google/protobuf/map_field_lite.h>\n";
    }
    io::Printer::Print(printer,pcVar2);
  }
  bVar1 = HasEnumDefinitions(this->file_);
  if (bVar1) {
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
      pcVar2 = "#include <google/protobuf/generated_enum_reflection.h>\n";
    }
    else {
      pcVar2 = "#include <google/protobuf/generated_enum_util.h>\n";
    }
    io::Printer::Print(printer,pcVar2);
  }
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    io::Printer::Print(printer,"#include <google/protobuf/service.h>\n");
  }
  descriptor = this->file_;
  if ((((this->options_).enforce_lite == false) &&
      (*(int *)(*(long *)(descriptor + 0xa0) + 0xa8) != 3)) &&
     ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    io::Printer::Print(printer,"#include <google/protobuf/unknown_field_set.h>\n");
    descriptor = this->file_;
  }
  bVar1 = IsAnyMessage(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,"#include <google/protobuf/any.h>\n");
  }
  return;
}

Assistant:

void FileGenerator::GenerateLibraryIncludes(io::Printer* printer) {

  printer->Print(
    "#include <google/protobuf/stubs/common.h>\n"
    "\n");

  // Verify the protobuf library header version is compatible with the protoc
  // version before going any further.
  printer->Print(
    "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n"
    "#error This file was generated by a newer version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please update\n"
    "#error your headers.\n"
    "#endif\n"
    "#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n"
    "#error This file was generated by an older version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please\n"
    "#error regenerate this file with a newer version of protoc.\n"
    "#endif\n"
    "\n",
    "min_header_version",
      SimpleItoa(protobuf::internal::kMinHeaderVersionForProtoc),
    "protoc_version", SimpleItoa(GOOGLE_PROTOBUF_VERSION));

  // OK, it's now safe to #include other files.
  printer->Print(
      "#include <google/protobuf/io/coded_stream.h>\n"
      "#include <google/protobuf/arena.h>\n"
      "#include <google/protobuf/arenastring.h>\n"
      "#include <google/protobuf/generated_message_table_driven.h>\n"
      "#include <google/protobuf/generated_message_util.h>\n");

  if (HasDescriptorMethods(file_, options_)) {
    printer->Print(
      "#include <google/protobuf/metadata.h>\n");
  } else {
    printer->Print(
      "#include <google/protobuf/metadata_lite.h>\n");
  }

  if (!message_generators_.empty()) {
    if (HasDescriptorMethods(file_, options_)) {
      printer->Print(
        "#include <google/protobuf/message.h>\n");
    } else {
      printer->Print(
        "#include <google/protobuf/message_lite.h>\n");
    }
  }
  printer->Print(
    "#include <google/protobuf/repeated_field.h>"
    "  // IWYU pragma: export\n"
    "#include <google/protobuf/extension_set.h>"
    "  // IWYU pragma: export\n");
  if (HasMapFields(file_)) {
    printer->Print(
        "#include <google/protobuf/map.h>"
        "  // IWYU pragma: export\n");
    if (HasDescriptorMethods(file_, options_)) {
      printer->Print(
          "#include <google/protobuf/map_field_inl.h>\n");
    } else {
      printer->Print(
          "#include <google/protobuf/map_field_lite.h>\n");
    }
  }

  if (HasEnumDefinitions(file_)) {
    if (HasDescriptorMethods(file_, options_)) {
      printer->Print(
          "#include <google/protobuf/generated_enum_reflection.h>\n");
    } else {
      printer->Print(
          "#include <google/protobuf/generated_enum_util.h>\n");
    }
  }

  if (HasGenericServices(file_, options_)) {
    printer->Print(
      "#include <google/protobuf/service.h>\n");
  }

  if (UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    printer->Print(
      "#include <google/protobuf/unknown_field_set.h>\n");
  }


  if (IsAnyMessage(file_)) {
    printer->Print(
      "#include <google/protobuf/any.h>\n");
  }
}